

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

FlagTypes Js::ConfigFlagsTable::GetFlagType(Flag flag)

{
  FlagTypes FVar1;
  undefined2 in_register_0000003a;
  
  FVar1 = InvalidFlagType;
  if (CONCAT22(in_register_0000003a,flag) < 0x1d6) {
    FVar1 = *(FlagTypes *)(&DAT_00fb6a80 + (ulong)flag * 4);
  }
  return FVar1;
}

Assistant:

FlagTypes
    ConfigFlagsTable::GetFlagType(Flag flag)
    {
        switch(flag)
        {
    #define FLAG(type, name, ...) \
            case name##Flag : \
                return Flag##type; \

    #include "ConfigFlagsList.h"

            default:
                return InvalidFlagType;
        }
    }